

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadCertificate.h
# Opt level: O3

string * build_path(string *__return_storage_ptr__,string *crt_dirpath,string *domain_name,
                   string *crt_filename)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_88 [2];
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  pcVar1 = (crt_dirpath->_M_dataplus)._M_p;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + crt_dirpath->_M_string_length);
  std::__cxx11::string::append((char *)local_88);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_88,(ulong)(domain_name->_M_dataplus)._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_38 = *plVar4;
    lStack_30 = plVar3[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar4;
    local_48 = (long *)*plVar3;
  }
  local_40 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_48,(ulong)(crt_filename->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string build_path(const std::string& crt_dirpath,
                         const std::string& domain_name, 
                           const std::string& crt_filename) {
    return crt_dirpath + "/" + domain_name + "/" + crt_filename;
}